

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::Client(Client *this,string *address,int port)

{
  (this->super_TCP)._vptr_TCP = (_func_int **)&PTR_Connect_00104d58;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->collocutor)._M_dataplus._M_p = (pointer)&(this->collocutor).field_2;
  (this->collocutor)._M_string_length = 0;
  (this->collocutor).field_2._M_local_buf[0] = '\0';
  (this->ip)._M_dataplus._M_p = (pointer)&(this->ip).field_2;
  (this->ip)._M_string_length = 0;
  (this->ip).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->ip);
  this->port = port;
  std::operator<<((ostream *)&std::cout,"[!] Write your nickname: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&this->name);
  std::operator<<((ostream *)&std::cout,"[!] Choose your friend: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&this->collocutor);
  return;
}

Assistant:

Client::Client(std::string address, int port) {
    this->ip = address;
    this->port = port;

    std::cout << "[!] Write your nickname: ";
    std::getline(std::cin, this->name);
    std::cout << "[!] Choose your friend: ";
    std::getline(std::cin, this->collocutor);
}